

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Decode
          (Mode5InterrogatorBasicData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  Mode5InterrogatorBasicData *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = operator>>(local_18,&(this->m_Status).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32MsgFormats);
  pKVar2 = operator>>(pKVar2,(DataTypeBase *)&this->m_InterrogatedID);
  KDataStream::operator>>(pKVar2,&this->m_ui16Padding2);
  return;
}

Assistant:

void Mode5InterrogatorBasicData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_5_INTERROGATOR_BASIC_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );
	
    stream >> KDIS_STREAM m_Status
		   >> m_ui8Padding
		   >> m_ui16Padding1
		   >> m_ui32MsgFormats
		   >> KDIS_STREAM m_InterrogatedID
		   >> m_ui16Padding2;	
}